

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioAppearance.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::RadioAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,RadioAppearance *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  RadioAppearance *local_18;
  RadioAppearance *this_local;
  
  local_18 = this;
  this_local = (RadioAppearance *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Radio:");
  poVar1 = std::operator<<(poVar1,"\n\tFrozen Status:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x15 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tState:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x17 & 1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString RadioAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "Radio:"
       << "\n\tFrozen Status:  " << m_FrozenStatus
       << "\n\tState:          " << m_State
       << "\n";

    return ss.str();
}